

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O3

void __thiscall
helics::NetworkCommsInterface::loadNetworkInfo
          (NetworkCommsInterface *this,NetworkBrokerData *netInfo)

{
  string *this_00;
  string *networkAddress;
  bool bVar1;
  int iVar2;
  string bTarget;
  string local_68;
  string local_48;
  
  CommsInterface::loadNetworkInfo(&this->super_CommsInterface,netInfo);
  bVar1 = CommsInterface::propertyLock(&this->super_CommsInterface);
  if (bVar1) {
    this->brokerPort = netInfo->brokerPort;
    LOCK();
    (this->PortNumber).super___atomic_base<int>._M_i = netInfo->portNumber;
    UNLOCK();
    this->maxRetries = netInfo->maxRetries;
    if (this->networkType < IP) {
      gmlc::networking::removeProtocol(&(this->super_CommsInterface).brokerTargetAddress);
      gmlc::networking::removeProtocol(&(this->super_CommsInterface).localTargetAddress);
    }
    if ((this->super_CommsInterface).localTargetAddress._M_string_length == 0) {
      this_00 = &(this->super_CommsInterface).localTargetAddress;
      networkAddress = &(this->super_CommsInterface).brokerTargetAddress;
      gmlc::networking::stripProtocol(&local_68,networkAddress);
      iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68
                      ,"localhost");
      if ((iVar2 == 0) ||
         (iVar2 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_68,"127.0.0.1"), iVar2 == 0)) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,0,
                   (this->super_CommsInterface).localTargetAddress._M_string_length,"localhost",9);
      }
      else if (local_68._M_string_length == 0) {
        if ((this->super_CommsInterface).interfaceNetwork == LOCAL) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                    "localhost");
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         this_00,0,(this->super_CommsInterface).localTargetAddress._M_string_length,
                         1,'*');
        }
      }
      else {
        gmlc::networking::generateMatchingInterfaceAddress
                  (&local_48,networkAddress,(this->super_CommsInterface).interfaceNetwork);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    if (0 < netInfo->portStart) {
      (this->openPorts).startingPort = netInfo->portStart;
    }
    if ((this->super_CommsInterface).mRequireBrokerConnection == true) {
      if ((this->brokerPort < 0) && (-1 < netInfo->connectionPort)) {
        this->brokerPort = netInfo->connectionPort;
      }
    }
    else if (((this->PortNumber).super___atomic_base<int>._M_i < 0) &&
            (-1 < netInfo->connectionPort)) {
      LOCK();
      (this->PortNumber).super___atomic_base<int>._M_i = netInfo->connectionPort;
      UNLOCK();
    }
    if (0 < (this->PortNumber).super___atomic_base<int>._M_i) {
      this->autoPortNumber = false;
    }
    this->useOsPortAllocation = netInfo->use_os_port;
    this->appendNameToAddress = netInfo->appendNameToAddress;
    this->noAckConnection = netInfo->noAckConnection;
    (this->super_CommsInterface).useJsonSerialization = netInfo->useJsonSerialization;
    bVar1 = netInfo->encrypted;
    this->encrypted = bVar1;
    this->forceConnection = netInfo->forceConnection;
    if (bVar1 == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "encryption not enabled in HELICS, recompile with encryption enabled if required",
                 0x4f);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
      std::ostream::put(-0x38);
      std::ostream::flush();
    }
    CommsInterface::propertyUnLock(&this->super_CommsInterface);
    return;
  }
  return;
}

Assistant:

void NetworkCommsInterface::loadNetworkInfo(const NetworkBrokerData& netInfo)
{
    using gmlc::networking::InterfaceTypes;
    using gmlc::networking::removeProtocol;

    CommsInterface::loadNetworkInfo(netInfo);
    if (!propertyLock()) {
        return;
    }
    brokerPort = netInfo.brokerPort;
    PortNumber = netInfo.portNumber;
    maxRetries = netInfo.maxRetries;
    switch (networkType) {
        case InterfaceTypes::TCP:
        case InterfaceTypes::UDP:
            removeProtocol(brokerTargetAddress);
            removeProtocol(localTargetAddress);
            break;
        default:
            break;
    }
    if (localTargetAddress.empty()) {
        auto bTarget = gmlc::networking::stripProtocol(brokerTargetAddress);
        if ((bTarget == localHostString) || (bTarget == "127.0.0.1")) {
            localTargetAddress = localHostString;
        } else if (bTarget.empty()) {
            switch (interfaceNetwork) {
                case gmlc::networking::InterfaceNetworks::LOCAL:
                    localTargetAddress = localHostString;
                    break;
                default:
                    localTargetAddress.assign(1, '*');
                    break;
            }
        } else {
            localTargetAddress =
                generateMatchingInterfaceAddress(brokerTargetAddress, interfaceNetwork);
        }
    }

    if (netInfo.portStart > 0) {
        openPorts.setStartingPortNumber(netInfo.portStart);
    }

    if (mRequireBrokerConnection) {
        if (brokerPort < 0 && netInfo.connectionPort >= 0) {
            brokerPort = netInfo.connectionPort;
        }
    } else {
        if (PortNumber < 0 && netInfo.connectionPort >= 0) {
            PortNumber = netInfo.connectionPort;
        }
    }

    if (PortNumber > 0) {
        autoPortNumber = false;
    }
    useOsPortAllocation = netInfo.use_os_port;
    appendNameToAddress = netInfo.appendNameToAddress;
    noAckConnection = netInfo.noAckConnection;
    useJsonSerialization = netInfo.useJsonSerialization;
    encrypted = netInfo.encrypted;
    forceConnection = netInfo.forceConnection;
#ifndef HELICS_ENABLE_ENCRYPTION
    if (encrypted) {
        std::cerr
            << "encryption not enabled in HELICS, recompile with encryption enabled if required"
            << std::endl;
    }
#endif
    propertyUnLock();
}